

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O3

void __thiscall Fl_Tabs::draw_tab(Fl_Tabs *this,int x1,int x2,int W,int H,Fl_Widget *o,int what)

{
  byte bVar1;
  Fl_Color FVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  Fl_Color FVar7;
  Fl_Tabs *pFVar8;
  Fl_Boxtype t;
  int iVar9;
  ulong uVar10;
  uint X;
  uint uVar11;
  uint uVar12;
  
  bVar3 = what != 2;
  iVar5 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar6 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  cVar4 = fl_draw_shortcut;
  fl_draw_shortcut = '\x01';
  bVar1 = (this->super_Fl_Group).super_Fl_Widget.box_;
  t = (Fl_Boxtype)((1 < bVar1 && (this->push_ == o && bVar3)) | bVar1);
  iVar9 = (uint)(what == 2) * 2;
  uVar12 = (uint)bVar3;
  X = x2 - W;
  if (what != 1) {
    X = x1;
  }
  if (W + x1 <= x2) {
    X = x1;
  }
  uVar11 = x2 - X;
  if (H < 0) {
    if (what == 2) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,(ulong)X,
                 (ulong)(uint)((H - iVar6) + (this->super_Fl_Group).super_Fl_Widget.y_ +
                              (this->super_Fl_Group).super_Fl_Widget.h_),(ulong)uVar11,
                 (ulong)(uint)(iVar6 - H));
      pFVar8 = this;
    }
    else {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,(ulong)X,
                 (ulong)(uint)((this->super_Fl_Group).super_Fl_Widget.y_ + H +
                              (this->super_Fl_Group).super_Fl_Widget.h_),(ulong)uVar11,
                 (ulong)(uint)-H);
      pFVar8 = (Fl_Tabs *)o;
    }
    iVar5 = iVar5 - H;
    Fl_Widget::draw_box((Fl_Widget *)this,t,X,
                        ((this->super_Fl_Group).super_Fl_Widget.y_ - iVar5) +
                        (this->super_Fl_Group).super_Fl_Widget.h_ + -10,W,iVar9 + 8 + iVar5,
                        (pFVar8->super_Fl_Group).super_Fl_Widget.color2_);
    FVar2 = (o->label_).color;
    FVar7 = FVar2;
    if (what == 2) {
      FVar7 = (this->super_Fl_Group).super_Fl_Widget.label_.color;
    }
    (o->label_).color = FVar7;
    Fl_Widget::draw_label
              (o,X,((this->super_Fl_Group).super_Fl_Widget.y_ - iVar5) +
                   (this->super_Fl_Group).super_Fl_Widget.h_,W,iVar5 + uVar12 * -2,0);
    (o->label_).color = FVar2;
    if (((Fl_Tabs *)Fl::focus_ != this) || ((o->flags_ & 2) != 0)) goto LAB_001ce4f8;
    bVar1 = (this->super_Fl_Group).super_Fl_Widget.box_;
    iVar9 = ((this->super_Fl_Group).super_Fl_Widget.y_ - iVar5) +
            (this->super_Fl_Group).super_Fl_Widget.h_;
  }
  else {
    uVar10 = (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.y_;
    if (what == 2) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,(ulong)X,uVar10,(ulong)uVar11,(ulong)(uint)((iVar5 + H) - iVar6)
                );
      pFVar8 = this;
    }
    else {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,(ulong)X,uVar10,(ulong)uVar11,(ulong)(uint)H);
      pFVar8 = (Fl_Tabs *)o;
    }
    iVar5 = iVar5 + H;
    Fl_Widget::draw_box((Fl_Widget *)this,t,X,(this->super_Fl_Group).super_Fl_Widget.y_ + uVar12 * 2
                        ,W,iVar9 + iVar5 + 8,(pFVar8->super_Fl_Group).super_Fl_Widget.color2_);
    FVar2 = (o->label_).color;
    FVar7 = FVar2;
    if (what == 2) {
      FVar7 = (this->super_Fl_Group).super_Fl_Widget.label_.color;
    }
    (o->label_).color = FVar7;
    Fl_Widget::draw_label
              (o,X,uVar12 * 2 + (this->super_Fl_Group).super_Fl_Widget.y_,W,iVar5 + uVar12 * -2,0);
    (o->label_).color = FVar2;
    if (((Fl_Tabs *)Fl::focus_ != this) || ((o->flags_ & 2) != 0)) goto LAB_001ce4f8;
    bVar1 = (this->super_Fl_Group).super_Fl_Widget.box_;
    iVar9 = (this->super_Fl_Group).super_Fl_Widget.y_;
  }
  Fl_Widget::draw_focus((Fl_Widget *)this,(uint)bVar1,X,iVar9,W,iVar5);
LAB_001ce4f8:
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  fl_draw_shortcut = cVar4;
  return;
}

Assistant:

void Fl_Tabs::draw_tab(int x1, int x2, int W, int H, Fl_Widget* o, int what) {
  int sel = (what == SELECTED);
  int dh = Fl::box_dh(box());
  int dy = Fl::box_dy(box());
  char prev_draw_shortcut = fl_draw_shortcut;
  fl_draw_shortcut = 1;

  Fl_Boxtype bt = (o==push_ &&!sel) ? fl_down(box()) : box();

  // compute offsets to make selected tab look bigger
  int yofs = sel ? 0 : BORDER;

  if ((x2 < x1+W) && what == RIGHT) x1 = x2 - W;

  if (H >= 0) {
    if (sel) fl_push_clip(x1, y(), x2 - x1, H + dh - dy);
    else fl_push_clip(x1, y(), x2 - x1, H);

    H += dh;

    Fl_Color c = sel ? selection_color() : o->selection_color();

    draw_box(bt, x1, y() + yofs, W, H + 10 - yofs, c);

    // Save the previous label color
    Fl_Color oc = o->labelcolor();

    // Draw the label using the current color...
    o->labelcolor(sel ? labelcolor() : o->labelcolor());
    o->draw_label(x1, y() + yofs, W, H - yofs, FL_ALIGN_CENTER);

    // Restore the original label color...
    o->labelcolor(oc);

    if (Fl::focus() == this && o->visible())
      draw_focus(box(), x1, y(), W, H);

    fl_pop_clip();
  } else {
    H = -H;

    if (sel) fl_push_clip(x1, y() + h() - H - dy, x2 - x1, H + dy);
    else fl_push_clip(x1, y() + h() - H, x2 - x1, H);

    H += dh;

    Fl_Color c = sel ? selection_color() : o->selection_color();

    draw_box(bt, x1, y() + h() - H - 10, W, H + 10 - yofs, c);

    // Save the previous label color
    Fl_Color oc = o->labelcolor();

    // Draw the label using the current color...
    o->labelcolor(sel ? labelcolor() : o->labelcolor());
    o->draw_label(x1, y() + h() - H, W, H - yofs, FL_ALIGN_CENTER);

    // Restore the original label color...
    o->labelcolor(oc);

    if (Fl::focus() == this && o->visible())
      draw_focus(box(), x1, y() + h() - H, W, H);

    fl_pop_clip();
  }
  fl_draw_shortcut = prev_draw_shortcut;
}